

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

pool_ref<soul::AST::Function> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::Function>
          (RewritingASTVisitor *this,pool_ref<soul::AST::Function> *o)

{
  ASTObject *pAVar1;
  long lVar2;
  undefined8 *in_RDX;
  
  pAVar1 = visitObject((RewritingASTVisitor *)o,(ASTObject *)*in_RDX);
  lVar2 = __dynamic_cast(pAVar1,&AST::ASTObject::typeinfo,&AST::Function::typeinfo,0);
  if (lVar2 != 0) {
    this->_vptr_RewritingASTVisitor = (_func_int **)pAVar1;
    return (pool_ref<soul::AST::Function>)(Function *)this;
  }
  throwInternalCompilerError("is_type<Type> (result)","visitAs",0x1d5);
}

Assistant:

pool_ref<Type> visitAs (pool_ref<Type> o)
    {
        auto& result = visitObject (o.getReference());
        SOUL_ASSERT (is_type<Type> (result));
        return static_cast<Type&> (result);
    }